

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

longlong Utils::vectEightBytesToUnsignedInt
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  value_type vVar1;
  uint uVar2;
  value_type vVar3;
  uint uVar4;
  value_type vVar5;
  uint uVar6;
  value_type vVar7;
  reference pvVar8;
  longlong result7;
  longlong result6;
  uint result5;
  uint result4;
  longlong result3;
  uint result2;
  uint result;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)pos);
  vVar1 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 1))
  ;
  uVar2 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 2))
  ;
  vVar3 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 3))
  ;
  uVar4 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 4))
  ;
  vVar5 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 5))
  ;
  uVar6 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 6))
  ;
  vVar7 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 7))
  ;
  return CONCAT44((vVar1 << 8 | uVar2) << 0x10 | vVar3 << 8 | uVar4,
                  (vVar5 << 8 | uVar6) << 0x10 | vVar7 << 8 | *pvVar8);
}

Assistant:

long long int Utils::vectEightBytesToUnsignedInt(std::vector<unsigned int> vec, int pos) {
    unsigned int result = (vec[pos+0] << 8) | vec[pos+1];
    unsigned int result2 = (vec[pos+2] << 8) | vec[pos+3];
    long long int result3 = (result << 16) | result2;

    unsigned int result4 = (vec[pos+4] << 8) | vec[pos+5];
    unsigned int result5 = (vec[pos+6] << 8) | vec[pos+7];
    long long int result6 = (result4 << 16) | result5;

    long long int result7 = (result3 << 32) | result6;
    return  result7;
}